

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Statistics::~Statistics(Statistics *this)

{
  undefined8 *in_RDI;
  
  (*(code *)**(undefined8 **)*in_RDI)();
  (*(code *)**(undefined8 **)in_RDI[1])();
  (*(code *)**(undefined8 **)in_RDI[2])();
  (*(code *)**(undefined8 **)in_RDI[3])();
  (*(code *)**(undefined8 **)in_RDI[4])();
  (*(code *)**(undefined8 **)in_RDI[5])();
  (*(code *)**(undefined8 **)in_RDI[6])();
  (*(code *)**(undefined8 **)in_RDI[7])();
  (*(code *)**(undefined8 **)in_RDI[8])();
  (*(code *)**(undefined8 **)in_RDI[9])();
  (*(code *)**(undefined8 **)in_RDI[10])();
  spx_free<soplex::Timer*>((Timer **)0x608021);
  spx_free<soplex::Timer*>((Timer **)0x60802f);
  spx_free<soplex::Timer*>((Timer **)0x60803d);
  spx_free<soplex::Timer*>((Timer **)0x60804b);
  spx_free<soplex::Timer*>((Timer **)0x608059);
  spx_free<soplex::Timer*>((Timer **)0x608067);
  spx_free<soplex::Timer*>((Timer **)0x608075);
  spx_free<soplex::Timer*>((Timer **)0x608083);
  spx_free<soplex::Timer*>((Timer **)0x608091);
  spx_free<soplex::Timer*>((Timer **)0x60809f);
  spx_free<soplex::Timer*>((Timer **)0x6080ad);
  return;
}

Assistant:

~Statistics()
   {
      // we need to free all timers again (allocation happens in constructor)
      readingTime->~Timer();
      solvingTime->~Timer();
      preprocessingTime->~Timer();
      simplexTime->~Timer();
      syncTime->~Timer();
      transformTime->~Timer();
      rationalTime->~Timer();
      initialPrecisionTime->~Timer();
      extendedPrecisionTime->~Timer();
      reconstructionTime->~Timer();
      boostingStepTime->~Timer();
      spx_free(readingTime);
      spx_free(solvingTime);
      spx_free(preprocessingTime);
      spx_free(simplexTime);
      spx_free(syncTime);
      spx_free(transformTime);
      spx_free(rationalTime);
      spx_free(initialPrecisionTime);
      spx_free(extendedPrecisionTime);
      spx_free(reconstructionTime);
      spx_free(boostingStepTime);
   }